

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_traits.h
# Opt level: O3

StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
google::protobuf::json_internal::Proto3Type::EnumNameByNumber_abi_cxx11_
          (StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Proto3Type *this,Field f,int32_t number)

{
  long lVar1;
  Rep *pRVar2;
  long *plVar3;
  RepeatedPtrFieldBase *pRVar4;
  RepeatedPtrFieldBase *this_00;
  StatusOr<const_google::protobuf::json_internal::ResolverPool::Enum_*> e;
  Status _status;
  Status local_70;
  anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Enum_*>_1
  local_68;
  long local_60;
  anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Enum_*>_1
  local_58;
  undefined8 local_50;
  long local_48 [2];
  InternalMetadata local_38;
  code *local_30;
  
  ResolverPool::Field::EnumType((Field *)&local_68.status_);
  local_58 = local_68;
  if (((ulong)local_68 & 1) == 0) {
    LOCK();
    *(int *)local_68 = *(int *)local_68 + 1;
    UNLOCK();
  }
  if (local_68 ==
      (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Enum_*>_1
       )0x1) {
    this_00 = (RepeatedPtrFieldBase *)(local_60 + 0x20);
    pRVar4 = this_00;
    if ((*(byte *)(local_60 + 0x20) & 1) != 0) {
      pRVar2 = internal::RepeatedPtrFieldBase::rep(this_00);
      pRVar4 = (RepeatedPtrFieldBase *)pRVar2->elements;
      if (((ulong)this_00->tagged_rep_or_elem_ & 1) != 0) {
        pRVar2 = internal::RepeatedPtrFieldBase::rep(this_00);
        this_00 = (RepeatedPtrFieldBase *)pRVar2->elements;
      }
    }
    for (; pRVar4 != (RepeatedPtrFieldBase *)
                     (&this_00->tagged_rep_or_elem_ + *(int *)(local_60 + 0x28));
        pRVar4 = (RepeatedPtrFieldBase *)&pRVar4->current_size_) {
      if (*(int *)((long)pRVar4->tagged_rep_or_elem_ + 0x30) == (int)f) {
        plVar3 = (long *)(*(ulong *)((long)pRVar4->tagged_rep_or_elem_ + 0x28) & 0xfffffffffffffffc)
        ;
        (__return_storage_ptr__->
        super_StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).field_1.data_._M_dataplus._M_p =
             (pointer)((long)&(__return_storage_ptr__->
                              super_StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ).field_1 + 0x10);
        lVar1 = *plVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   &(__return_storage_ptr__->
                    super_StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).field_1,lVar1,plVar3[1] + lVar1);
        (__return_storage_ptr__->
        super_StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).field_0 = (anon_union_8_1_1246618d_for_StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_1
                     )0x1;
        goto LAB_002d38d9;
      }
    }
    local_30 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
    local_38.ptr_ = (ulong)f & 0xffffffff;
    absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
              (&local_58,"unknown enum number: \'%d\'",0x19,&local_38,1);
    absl::lts_20240722::InvalidArgumentError(&local_70,local_50,local_58);
    absl::lts_20240722::internal_statusor::
    StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    StatusOrData<absl::lts_20240722::Status,_0>
              (&__return_storage_ptr__->
                super_StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ,&local_70);
    if ((local_70.rep_ & 1) == 0) {
      absl::lts_20240722::status_internal::StatusRep::Unref();
    }
    if (local_58 !=
        (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Enum_*>_1
         )local_48) {
      operator_delete((void *)local_58,local_48[0] + 1);
    }
  }
  else {
    absl::lts_20240722::internal_statusor::
    StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    StatusOrData<const_absl::lts_20240722::Status,_0>
              (&__return_storage_ptr__->
                super_StatusOrData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ,&local_58.status_);
    absl::lts_20240722::Status::~Status(&local_58.status_);
  }
LAB_002d38d9:
  absl::lts_20240722::internal_statusor::
  StatusOrData<const_google::protobuf::json_internal::ResolverPool::Enum_*>::~StatusOrData
            ((StatusOrData<const_google::protobuf::json_internal::ResolverPool::Enum_*> *)
             &local_68.status_);
  return __return_storage_ptr__;
}

Assistant:

static absl::StatusOr<std::string> EnumNameByNumber(Field f, int32_t number) {
    auto e = f->EnumType();
    RETURN_IF_ERROR(e.status());

    for (const auto& ev : (**e).proto().enumvalue()) {
      if (ev.number() == number) {
        return ev.name();
      }
    }
    return absl::InvalidArgumentError(
        absl::StrFormat("unknown enum number: '%d'", number));
  }